

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

int mpi_miller_rabin(mbedtls_mpi *X,size_t rounds,_func_int_void_ptr_uchar_ptr_size_t *f_rng,
                    void *p_rng)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  int iVar7;
  mbedtls_mpi _B;
  mbedtls_mpi_uint p [1];
  mbedtls_mpi A;
  mbedtls_mpi W;
  mbedtls_mpi R;
  mbedtls_mpi RR;
  mbedtls_mpi T;
  size_t local_f0;
  mbedtls_mpi local_e8;
  mbedtls_mpi_uint local_d0;
  mbedtls_mpi local_c8;
  mbedtls_mpi local_b0;
  size_t local_98;
  void *local_90;
  ulong local_88;
  size_t local_80;
  mbedtls_mpi local_78;
  mbedtls_mpi local_60;
  mbedtls_mpi local_48;
  
  local_b0.s = 1;
  local_b0.n = 0;
  local_b0.p = (mbedtls_mpi_uint *)0x0;
  local_78.s = 1;
  local_78.n = 0;
  local_78.p = (mbedtls_mpi_uint *)0x0;
  local_48.s = 1;
  local_48.n = 0;
  local_48.p = (mbedtls_mpi_uint *)0x0;
  local_c8.s = 1;
  local_c8.n = 0;
  local_c8.p = (mbedtls_mpi_uint *)0x0;
  local_60.s = 1;
  local_60.n = 0;
  local_60.p = (mbedtls_mpi_uint *)0x0;
  local_d0 = 1;
  local_e8.s = 1;
  local_e8.n = 1;
  local_e8.p = &local_d0;
  iVar1 = mbedtls_mpi_sub_mpi(&local_b0,X,&local_e8);
  if (iVar1 == 0) {
    if (local_b0.n != 0) {
      lVar3 = 0;
      sVar5 = 0;
      do {
        uVar6 = 0;
        do {
          if ((local_b0.p[sVar5] >> (uVar6 & 0x3f) & 1) != 0) {
            local_f0 = uVar6 - lVar3;
            goto LAB_0011ee60;
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 != 0x40);
        sVar5 = sVar5 + 1;
        lVar3 = lVar3 + -0x40;
      } while (sVar5 != local_b0.n);
    }
    local_f0 = 0;
LAB_0011ee60:
    iVar1 = mbedtls_mpi_copy(&local_78,&local_b0);
    if ((iVar1 == 0) && (iVar1 = mbedtls_mpi_shift_r(&local_78,local_f0), iVar1 == 0)) {
      if (rounds != 0) {
        local_98 = 0;
        local_90 = p_rng;
        local_80 = rounds;
LAB_0011ef00:
        iVar1 = mbedtls_mpi_fill_random(&local_c8,X->n << 3,f_rng,local_90);
        if (iVar1 == 0) {
          iVar4 = 0x20;
          do {
            sVar5 = mbedtls_mpi_bitlen(&local_c8);
            sVar2 = mbedtls_mpi_bitlen(&local_b0);
            if (sVar2 < sVar5) {
              local_c8.p[local_c8.n - 1] =
                   local_c8.p[local_c8.n - 1] & ~(-1L << ((char)sVar2 - 1U & 0x3f));
            }
            iVar7 = -0xe;
            iVar4 = iVar4 + -1;
            iVar1 = iVar7;
            if (iVar4 == 0) break;
            iVar1 = mbedtls_mpi_cmp_mpi(&local_c8,&local_b0);
            if (iVar1 < 0) {
              local_d0 = 1;
              local_e8.s = 1;
              local_e8.n = 1;
              local_e8.p = &local_d0;
              iVar1 = mbedtls_mpi_cmp_mpi(&local_c8,&local_e8);
              if (0 < iVar1) goto LAB_0011efe8;
            }
            iVar1 = mbedtls_mpi_fill_random(&local_c8,X->n << 3,f_rng,local_90);
            if (iVar1 != 0) break;
          } while( true );
        }
        goto LAB_0011ee8f;
      }
      iVar1 = 0;
    }
  }
LAB_0011ee8f:
  mbedtls_mpi_free(&local_b0);
  mbedtls_mpi_free(&local_78);
  mbedtls_mpi_free(&local_48);
  mbedtls_mpi_free(&local_c8);
  mbedtls_mpi_free(&local_60);
  return iVar1;
LAB_0011efe8:
  iVar1 = mbedtls_mpi_exp_mod(&local_c8,&local_c8,&local_78,X,&local_60);
  if (iVar1 != 0) goto LAB_0011ee8f;
  iVar1 = mbedtls_mpi_cmp_mpi(&local_c8,&local_b0);
  if (iVar1 != 0) {
    local_d0 = 1;
    local_e8.s = 1;
    local_e8.n = 1;
    local_e8.p = &local_d0;
    iVar1 = mbedtls_mpi_cmp_mpi(&local_c8,&local_e8);
    if (iVar1 != 0) {
      if (1 < local_f0) {
        uVar6 = 2;
        while( true ) {
          iVar1 = mbedtls_mpi_cmp_mpi(&local_c8,&local_b0);
          if (iVar1 == 0) break;
          local_88 = uVar6;
          iVar1 = mbedtls_mpi_mul_mpi(&local_48,&local_c8,&local_c8);
          if ((iVar1 != 0) || (iVar1 = mbedtls_mpi_mod_mpi(&local_c8,&local_48,X), iVar1 != 0))
          goto LAB_0011ee8f;
          local_d0 = 1;
          local_e8.s = 1;
          local_e8.n = 1;
          local_e8.p = &local_d0;
          iVar1 = mbedtls_mpi_cmp_mpi(&local_c8,&local_e8);
          if ((iVar1 == 0) || (uVar6 = local_88 + 1, local_f0 <= local_88)) break;
        }
      }
      iVar4 = mbedtls_mpi_cmp_mpi(&local_c8,&local_b0);
      iVar1 = iVar7;
      if (iVar4 != 0) goto LAB_0011ee8f;
      local_d0 = 1;
      local_e8.s = 1;
      local_e8.n = 1;
      local_e8.p = &local_d0;
      iVar4 = mbedtls_mpi_cmp_mpi(&local_c8,&local_e8);
      if (iVar4 == 0) goto LAB_0011ee8f;
    }
  }
  local_98 = local_98 + 1;
  iVar1 = 0;
  if (local_98 == local_80) goto LAB_0011ee8f;
  goto LAB_0011ef00;
}

Assistant:

static int mpi_miller_rabin( const mbedtls_mpi *X, size_t rounds,
                             int (*f_rng)(void *, unsigned char *, size_t),
                             void *p_rng )
{
    int ret, count;
    size_t i, j, k, s;
    mbedtls_mpi W, R, T, A, RR;

    MPI_VALIDATE_RET( X     != NULL );
    MPI_VALIDATE_RET( f_rng != NULL );

    mbedtls_mpi_init( &W ); mbedtls_mpi_init( &R );
    mbedtls_mpi_init( &T ); mbedtls_mpi_init( &A );
    mbedtls_mpi_init( &RR );

    /*
     * W = |X| - 1
     * R = W >> lsb( W )
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &W, X, 1 ) );
    s = mbedtls_mpi_lsb( &W );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &R, &W ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &R, s ) );

    for( i = 0; i < rounds; i++ )
    {
        /*
         * pick a random A, 1 < A < |X| - 1
         */
        count = 0;
        do {
            MBEDTLS_MPI_CHK( mbedtls_mpi_fill_random( &A, X->n * ciL, f_rng, p_rng ) );

            j = mbedtls_mpi_bitlen( &A );
            k = mbedtls_mpi_bitlen( &W );
            if (j > k) {
                A.p[A.n - 1] &= ( (mbedtls_mpi_uint) 1 << ( k - ( A.n - 1 ) * biL - 1 ) ) - 1;
            }

            if (count++ > 30) {
                ret = MBEDTLS_ERR_MPI_NOT_ACCEPTABLE;
                goto cleanup;
            }

        } while ( mbedtls_mpi_cmp_mpi( &A, &W ) >= 0 ||
                  mbedtls_mpi_cmp_int( &A, 1 )  <= 0    );

        /*
         * A = A^R mod |X|
         */
        MBEDTLS_MPI_CHK( mbedtls_mpi_exp_mod( &A, &A, &R, X, &RR ) );

        if( mbedtls_mpi_cmp_mpi( &A, &W ) == 0 ||
            mbedtls_mpi_cmp_int( &A,  1 ) == 0 )
            continue;

        j = 1;
        while( j < s && mbedtls_mpi_cmp_mpi( &A, &W ) != 0 )
        {
            /*
             * A = A * A mod |X|
             */
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T, &A, &A ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &A, &T, X  ) );

            if( mbedtls_mpi_cmp_int( &A, 1 ) == 0 )
                break;

            j++;
        }

        /*
         * not prime if A != |X| - 1 or A == 1
         */
        if( mbedtls_mpi_cmp_mpi( &A, &W ) != 0 ||
            mbedtls_mpi_cmp_int( &A,  1 ) == 0 )
        {
            ret = MBEDTLS_ERR_MPI_NOT_ACCEPTABLE;
            break;
        }
    }

cleanup:
    mbedtls_mpi_free( &W ); mbedtls_mpi_free( &R );
    mbedtls_mpi_free( &T ); mbedtls_mpi_free( &A );
    mbedtls_mpi_free( &RR );

    return( ret );
}